

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.hpp
# Opt level: O0

void * __thiscall cppjit::builder::builder::compile(builder *this)

{
  int iVar1;
  cppjit_exception *this_00;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290 [32];
  ostream local_270 [8];
  ofstream kernel_file;
  allocator local_69;
  string local_68 [35];
  undefined1 local_45;
  allocator local_31;
  string local_30 [32];
  builder *local_10;
  builder *this_local;
  
  local_10 = this;
  if ((this->has_source_ & 1U) == 0) {
    local_45 = 1;
    this_00 = (cppjit_exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"source not set",&local_31);
    cppjit_exception::cppjit_exception(this_00,(string *)local_30);
    local_45 = 0;
    __cxa_throw(this_00,&cppjit_exception::typeinfo,cppjit_exception::~cppjit_exception);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,detail::DEFAULT_KERNEL_COMPILE_DIR,&local_69);
  make_compile_dir(this,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  if ((this->has_inline_source_ & 1U) != 0) {
    std::__cxx11::string::operator=((string *)&this->source_dir,(string *)&this->compile_dir);
    std::operator+(local_2b0,&this->source_dir);
    std::operator+(local_290,(char *)local_2b0);
    std::ofstream::ofstream(local_270,local_290,0x10);
    std::__cxx11::string::~string((string *)local_290);
    std::__cxx11::string::~string((string *)local_2b0);
    std::operator<<(local_270,(string *)&this->source);
    std::ofstream::close();
    std::ofstream::~ofstream(local_270);
  }
  iVar1 = (**this->_vptr_builder)();
  return (void *)CONCAT44(extraout_var,iVar1);
}

Assistant:

void *compile() {
    if (!has_source_) {
      throw cppjit_exception("source not set");
    }
    // make sure it actually exists
    make_compile_dir();

    if (has_inline_source_) {
      source_dir = compile_dir;
      std::ofstream kernel_file(source_dir + kernel_name + ".cpp");
      kernel_file << source;
      kernel_file.close();
    }

    return compile_impl();
  }